

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_access.c
# Opt level: O0

void * ecs_record_get_column(ecs_record_t *r,int32_t column,size_t c_size)

{
  int16_t offset;
  ecs_size_t eVar1;
  int32_t iVar2;
  _Bool local_51;
  _Bool local_49;
  int32_t row;
  _Bool is_watched;
  void *array;
  ecs_column_t *peStack_38;
  int16_t size;
  ecs_column_t *c;
  ecs_table_t *table;
  size_t c_size_local;
  ecs_record_t *peStack_18;
  int32_t column_local;
  ecs_record_t *r_local;
  
  c = (ecs_column_t *)r->table;
  table = (ecs_table_t *)c_size;
  c_size_local._4_4_ = column;
  peStack_18 = r;
  peStack_38 = da_get_column((ecs_table_t *)c,column);
  if (peStack_38 == (ecs_column_t *)0x0) {
    r_local = (ecs_record_t *)0x0;
  }
  else {
    array._6_2_ = peStack_38->size;
    eVar1 = ecs_from_size_t((size_t)table);
    local_51 = true;
    if (eVar1 != 0) {
      eVar1 = ecs_from_size_t((size_t)table);
      local_51 = eVar1 == peStack_38->size;
    }
    _ecs_assert(local_51,2,(char *)0x0,
                "!ecs_from_size_t(c_size) || ecs_from_size_t(c_size) == c->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
                ,0x10d);
    eVar1 = ecs_from_size_t((size_t)table);
    if (eVar1 != 0) {
      eVar1 = ecs_from_size_t((size_t)table);
      if (eVar1 != peStack_38->size) {
        __assert_fail("!ecs_from_size_t(c_size) || ecs_from_size_t(c_size) == c->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
                      ,0x10d,"void *ecs_record_get_column(ecs_record_t *, int32_t, size_t)");
      }
    }
    if (peStack_38->alignment < 0x10) {
      offset = 0x10;
    }
    else {
      offset = peStack_38->alignment;
    }
    _row = _ecs_vector_first(peStack_38->data,(int)peStack_38->size,offset);
    iVar2 = ecs_record_to_row(peStack_18->row,&local_49);
    r_local = (ecs_record_t *)((long)_row + (long)(array._6_2_ * iVar2));
  }
  return r_local;
}

Assistant:

void* ecs_record_get_column(
    ecs_record_t *r,
    int32_t column,
    size_t c_size)
{
    (void)c_size;
    ecs_table_t *table = r->table;
    ecs_column_t *c = da_get_column(table, column);
    if (!c) {
        return NULL;
    }

    int16_t size = c->size;
    ecs_assert(!ecs_from_size_t(c_size) || ecs_from_size_t(c_size) == c->size, 
        ECS_INVALID_PARAMETER, NULL);

    void *array = ecs_vector_first_t(c->data, c->size, c->alignment);
    bool is_watched;
    int32_t row = ecs_record_to_row(r->row, &is_watched);
    return ECS_OFFSET(array, size * row);
}